

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlinkbutton.cpp
# Opt level: O2

QRect __thiscall QCommandLinkButtonPrivate::descriptionRect(QCommandLinkButtonPrivate *this)

{
  int iVar1;
  int iVar2;
  QRect QVar3;
  QRect QVar4;
  
  QVar3 = QWidget::rect(*(QWidget **)
                         &(this->super_QPushButtonPrivate).super_QAbstractButtonPrivate.
                          super_QWidgetPrivate.field_0x8);
  iVar1 = textOffset(this);
  iVar2 = descriptionOffset(this);
  QVar4.y1.m_i = iVar2 + QVar3.y1.m_i.m_i;
  QVar4.x1.m_i = QVar3.x1.m_i.m_i + iVar1;
  QVar4._8_8_ = ((ulong)(QVar3.x2.m_i.m_i - 4) | QVar3._8_8_ & 0xffffffff00000000) - 0xa00000000;
  return QVar4;
}

Assistant:

QRect QCommandLinkButtonPrivate::descriptionRect() const
{
    Q_Q(const QCommandLinkButton);
    return q->rect().adjusted(textOffset(), descriptionOffset(),
                              -rightMargin(), -bottomMargin());
}